

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superAnd.c
# Opt level: O0

char * Super2_LibWriteGate_rec(Super2_Gate_t *pGate,int fInv,int Level)

{
  Super2_Gate_t *__s;
  char cVar1;
  uint fInv_00;
  uint fInv_01;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char local_58;
  int RetValue;
  int fInvNext2;
  int fInvNext1;
  Super2_Gate_t *pGateNext2;
  Super2_Gate_t *pGateNext1;
  char *pBuffer2;
  char *pBuffer1;
  char *pBranch;
  int Level_local;
  int fInv_local;
  Super2_Gate_t *pGate_local;
  
  pGate_local = (Super2_Gate_t *)Super2_LibWriteGate_rec::pBuffs1[Level];
  __s = (Super2_Gate_t *)Super2_LibWriteGate_rec::pBuffs2[Level];
  if (Level < 0) {
    __assert_fail("Level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/super/superAnd.c"
                  ,0x253,"char *Super2_LibWriteGate_rec(Super2_Gate_t *, int, int)");
  }
  if (pGate->pOne == (Super2_Gate_t *)0x0) {
    if (pGate->uTruth == 0) {
      cVar1 = '0';
      if (fInv != 0) {
        cVar1 = '1';
      }
      *(char *)&pGate_local->uTruth = cVar1;
      *(char *)((long)&pGate_local->uTruth + 1) = '$';
      *(char *)((long)&pGate_local->uTruth + 2) = '\0';
    }
    else {
      if (fInv == 0) {
        local_58 = (char)pGate->pTwo + 'a';
      }
      else {
        local_58 = (char)pGate->pTwo + 'A';
      }
      *(char *)&pGate_local->uTruth = local_58;
      *(char *)((long)&pGate_local->uTruth + 1) = '\0';
    }
  }
  else {
    if (Level < 1) {
      __assert_fail("Level > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/super/superAnd.c"
                    ,0x263,"char *Super2_LibWriteGate_rec(Super2_Gate_t *, int, int)");
    }
    fInv_00 = (uint)pGate->pOne & 1;
    pcVar3 = Super2_LibWriteGate_rec
                       ((Super2_Gate_t *)((ulong)pGate->pOne & 0xfffffffffffffffe),fInv_00,
                        Level + -1);
    strcpy((char *)pGate_local,pcVar3);
    fInv_01 = (uint)pGate->pTwo & 1;
    pcVar3 = Super2_LibWriteGate_rec
                       ((Super2_Gate_t *)((ulong)pGate->pTwo & 0xfffffffffffffffe),fInv_01,
                        Level + -1);
    if (fInv_00 == fInv_01) {
      iVar2 = Super2_LibWriteCompare((char *)pGate_local,pcVar3);
      if (iVar2 == 1) {
        uVar4 = 0x28;
        if (fInv != 0) {
          uVar4 = 0x3c;
        }
        uVar5 = 0x29;
        if (fInv != 0) {
          uVar5 = 0x3e;
        }
        sprintf((char *)__s,"%c%s%s%c",uVar4,pGate_local,pcVar3,uVar5);
        pGate_local = __s;
      }
      else {
        uVar4 = 0x28;
        if (fInv != 0) {
          uVar4 = 0x3c;
        }
        uVar5 = 0x29;
        if (fInv != 0) {
          uVar5 = 0x3e;
        }
        sprintf((char *)__s,"%c%s%s%c",uVar4,pcVar3,pGate_local,uVar5);
        pGate_local = __s;
        if (iVar2 == 0) {
          printf("Strange!\n");
        }
      }
    }
    else if (fInv_01 < fInv_00) {
      uVar4 = 0x28;
      if (fInv != 0) {
        uVar4 = 0x3c;
      }
      uVar5 = 0x29;
      if (fInv != 0) {
        uVar5 = 0x3e;
      }
      sprintf((char *)__s,"%c%s%s%c",uVar4,pGate_local,pcVar3,uVar5);
      pGate_local = __s;
    }
    else {
      uVar4 = 0x28;
      if (fInv != 0) {
        uVar4 = 0x3c;
      }
      uVar5 = 0x29;
      if (fInv != 0) {
        uVar5 = 0x3e;
      }
      sprintf((char *)__s,"%c%s%s%c",uVar4,pcVar3,pGate_local,uVar5);
      pGate_local = __s;
    }
  }
  return (char *)pGate_local;
}

Assistant:

char * Super2_LibWriteGate_rec( Super2_Gate_t * pGate, int fInv, int Level )
{
    static char Buff01[  3], Buff02[  3];    // Max0              =  1
    static char Buff11[  6], Buff12[  6];    // Max1 = 2*Max0 + 2 =  4
    static char Buff21[ 12], Buff22[ 12];    // Max2 = 2*Max1 + 2 = 10
    static char Buff31[ 25], Buff32[ 25];    // Max3 = 2*Max2 + 2 = 22
    static char Buff41[ 50], Buff42[ 50];    // Max4 = 2*Max3 + 2 = 46
    static char Buff51[100], Buff52[100];    // Max5 = 2*Max4 + 2 = 94
    static char * pBuffs1[6] = { Buff01, Buff11, Buff21, Buff31, Buff41, Buff51 };
    static char * pBuffs2[6] = { Buff02, Buff12, Buff22, Buff32, Buff42, Buff52 };
    char * pBranch;
    char * pBuffer1 = pBuffs1[Level];
    char * pBuffer2 = pBuffs2[Level];
    Super2_Gate_t * pGateNext1, * pGateNext2;
    int fInvNext1, fInvNext2;
    int RetValue;

    // consider the last level
    assert( Level >= 0 );
    if ( pGate->pOne == NULL )
    {
        if ( pGate->uTruth == 0 )
        {
            pBuffer1[0] = (fInv? '1': '0');
            pBuffer1[1] = '$';
            pBuffer1[2] = 0;
        }
        else
        {
            pBuffer1[0] = (fInv? 'A' + ((int)(ABC_PTRUINT_T)pGate->pTwo): 'a' + ((int)(ABC_PTRUINT_T)pGate->pTwo));
            pBuffer1[1] = 0;
        }
        return pBuffer1;
    }
    assert( Level > 0 );


    // get the left branch
    pGateNext1 = Super2_Regular(pGate->pOne);
    fInvNext1  = Super2_IsComplement(pGate->pOne);
    pBranch    = Super2_LibWriteGate_rec(pGateNext1, fInvNext1, Level - 1);
    // copy into Buffer1
    strcpy( pBuffer1, pBranch );

    // get the right branch
    pGateNext2 = Super2_Regular(pGate->pTwo);
    fInvNext2  = Super2_IsComplement(pGate->pTwo);
    pBranch    = Super2_LibWriteGate_rec(pGateNext2, fInvNext2, Level - 1);

    // consider the case when comparison is not necessary
    if ( fInvNext1 ^ fInvNext2 )
    {
        if ( fInvNext1 > fInvNext2 )
            sprintf( pBuffer2, "%c%s%s%c", (fInv? '<': '('), pBuffer1, pBranch, (fInv? '>': ')') );
        else
            sprintf( pBuffer2, "%c%s%s%c", (fInv? '<': '('), pBranch, pBuffer1, (fInv? '>': ')') );
    }
    else
    {
        // compare the two branches
        RetValue = Super2_LibWriteCompare( pBuffer1, pBranch );
        if ( RetValue == 1 )
            sprintf( pBuffer2, "%c%s%s%c", (fInv? '<': '('), pBuffer1, pBranch, (fInv? '>': ')') );
        else // if ( RetValue == -1 )
        {
            sprintf( pBuffer2, "%c%s%s%c", (fInv? '<': '('), pBranch, pBuffer1, (fInv? '>': ')') );
            if ( RetValue == 0 )
                printf( "Strange!\n" );
        }
    }
    return pBuffer2;
}